

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassicSudokuVisualizer.cpp
# Opt level: O2

string * __thiscall
ClassicSudokuVisualizer::createStyle_abi_cxx11_
          (string *__return_storage_ptr__,ClassicSudokuVisualizer *this)

{
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_30);
  createBorderBottomStyle_abi_cxx11_(&local_30,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  createBorderTopStyle_abi_cxx11_(&local_30,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  createBorderRightStyle_abi_cxx11_(&local_30,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  createBorderLeftStyle_abi_cxx11_(&local_30,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

const std::string ClassicSudokuVisualizer::createStyle() {
    std::string style = "";
    style.append(createBorderBottomStyle());
    style.append(createBorderTopStyle());
    style.append(createBorderRightStyle());
    style.append(createBorderLeftStyle());

    return style;
}